

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

void __thiscall dynet::Trainer::update(Trainer *this)

{
  pointer ppPVar1;
  pointer ppLVar2;
  LookupParameterStorage *pLVar3;
  ParameterCollectionStorage *pPVar4;
  __node_base *p_Var5;
  size_t i;
  ulong uVar6;
  float fVar7;
  
  if (this->aux_allocated == false) {
    (*this->_vptr_Trainer[4])(this);
    this->aux_allocated = true;
  }
  fVar7 = clip_gradients(this);
  pPVar4 = ParameterCollection::get_storage(this->model);
  uVar6 = 0;
  while( true ) {
    ppPVar1 = (pPVar4->params).
              super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pPVar4->params).
                      super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3) <= uVar6)
    break;
    if (ppPVar1[uVar6]->updated == true) {
      (*this->_vptr_Trainer[6])(fVar7,this,uVar6);
      ParameterStorage::clear
                ((pPVar4->params).
                 super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6]);
    }
    uVar6 = uVar6 + 1;
  }
  pPVar4 = ParameterCollection::get_storage(this->model);
  for (uVar6 = 0;
      ppLVar2 = (pPVar4->lookup_params).
                super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(pPVar4->lookup_params).
                            super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3);
      uVar6 = uVar6 + 1) {
    if (((this->sparse_updates_enabled == true) &&
        (pLVar3 = ppLVar2[uVar6], pLVar3->updated == true)) && (pLVar3->all_updated == false)) {
      p_Var5 = &(pLVar3->non_zero_grads)._M_h._M_before_begin;
      while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
        (*this->_vptr_Trainer[7])(fVar7,this,uVar6,(ulong)(uint)*(size_type *)(p_Var5 + 1));
      }
    }
    else {
      (*this->_vptr_Trainer[8])(fVar7,this,uVar6);
    }
    LookupParameterStorage::clear(ppLVar2[uVar6]);
  }
  this->updates = this->updates + 1.0;
  this->updates_since_status = this->updates_since_status + 1.0;
  pPVar4 = ParameterCollection::get_storage(this->model);
  fVar7 = (pPVar4->weight_decay).weight_decay;
  fVar7 = fVar7 - (pPVar4->weight_decay).lambda * fVar7;
  (pPVar4->weight_decay).weight_decay = fVar7;
  if (fVar7 < 0.25) {
    rescale_and_reset_weight_decay(this);
    return;
  }
  return;
}

Assistant:

void Trainer::update() {
  // Allocate if necessary
  if(!aux_allocated) {
    alloc_impl();
    aux_allocated = true;
  }

  // Perform gradient clipping and cycle through parameters
  const float gscale = clip_gradients();
  const auto & params = model->parameters_list();
  for(size_t i = 0; i < params.size(); ++i) {
    if(params[i]->updated) {
      update_params(gscale, i);
      params[i]->clear();
    }
  }
  const auto & lparams = model->lookup_parameters_list();
  for(size_t i = 0; i < lparams.size(); ++i) {
    auto &p = lparams[i];
    if(sparse_updates_enabled && p->updated && !p->all_updated) {
      for (auto j : p->non_zero_grads)
        update_lookup_params(gscale, i, j);
    } else {
      update_lookup_params(gscale, i);
    }
    p->clear();
  }
  ++updates;
  ++updates_since_status;

  L2WeightDecay & wd = model->get_weight_decay();
  wd.update_weight_decay(); // update global weight scale
  if (wd.parameters_need_rescaled())
    rescale_and_reset_weight_decay();  // if wdscale is getting to small multiply all weights by wdscale, and set wdscale to 1
}